

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cIncompleteTextureAccessTests.cpp
# Opt level: O0

void __thiscall gl4cts::IncompleteTextureAccess::SamplerTest::CleanCase(SamplerTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  SamplerTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_po != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_po);
    this->m_po = 0;
  }
  if (this->m_to != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to);
    this->m_to = 0;
  }
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void SamplerTest::CleanCase()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Program cleanup. */
	if (m_po)
	{
		gl.deleteProgram(m_po);

		m_po = 0;
	}

	/* Texture cleanup. */
	if (m_to)
	{
		gl.deleteTextures(1, &m_to);

		m_to = 0;
	}

	/* Errors cleanup. */
	while (gl.getError())
		;
}